

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O1

Module * mocker::allocateRegistersNaively(Module *__return_storage_ptr__,Module *module)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>_>
  *this;
  long lVar1;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *__position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  element_type *peVar4;
  undefined8 *puVar5;
  pointer psVar6;
  undefined8 uVar7;
  int iVar8;
  iterator iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  _List_node_base *p_Var12;
  long *plVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__k;
  long lVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long *plVar16;
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  funcBegs;
  RegMap<std::size_t> offsets;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_200;
  Module *local_1e8;
  OpType local_1dc;
  long *local_1d8;
  long lStack_1d0;
  long local_1c8;
  long *local_1c0;
  undefined1 local_1b8 [32];
  float local_198;
  size_t local_190;
  undefined1 auStack_188 [8];
  key_type local_180;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_160;
  long *local_158;
  long *local_150;
  Section local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  Line local_f0;
  Line local_c0;
  Line local_90;
  Line local_60;
  
  nasm::Module::Module(__return_storage_ptr__,module);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_188 + 8),".text","");
  this = &__return_storage_ptr__->sections;
  local_1e8 = __return_storage_ptr__;
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->_M_h,(key_type *)(auStack_188 + 8));
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_00128b73:
    std::__throw_out_of_range("_Map_base::at");
  }
  local_110 = &local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                             ._M_cur + 0x28),
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                             ._M_cur + 0x30) +
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                             ._M_cur + 0x28));
  local_148.name._M_dataplus._M_p = (pointer)&local_148.name.field_2;
  if (local_110 == &local_100) {
    local_148.name.field_2._8_8_ = local_100._8_8_;
  }
  else {
    local_148.name._M_dataplus._M_p = (pointer)local_110;
  }
  local_148.name.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
  local_148.name.field_2._M_local_buf[0] = local_100._M_local_buf[0];
  local_148.lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_148.lines;
  local_148.name._M_string_length = local_108;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_148.lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
  _M_node._M_size = 0;
  local_1c8 = 0;
  local_1d8 = (long *)0x0;
  lStack_1d0 = 0;
  p_Var12 = (_List_node_base *)
            ((long)iVar9.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                   ._M_cur + 0x48);
  local_1b8._0_8_ =
       *(long *)((long)iVar9.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                       ._M_cur + 0x48);
  local_160 = &this->_M_h;
  local_148.lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       local_148.lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  local_110 = &local_100;
  if ((_List_node_base *)local_1b8._0_8_ != p_Var12) {
    do {
      if (((_List_node_base *)(local_1b8._0_8_ + 0x30))->_M_next == (_List_node_base *)0x0) {
        if (((_List_node_base *)(local_1b8._0_8_ + 0x10))->_M_prev == (_List_node_base *)0x0) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
          goto LAB_00128b73;
        }
        if (*(char *)&((_List_node_base *)(local_1b8._0_8_ + 0x10))->_M_next->_M_next != '.') {
          std::
          vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
          ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>&>
                    ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                      *)&local_1d8,(_List_const_iterator<mocker::nasm::Line> *)local_1b8);
        }
      }
      local_1b8._0_8_ = *(_List_node_base **)local_1b8._0_8_;
    } while ((_List_node_base *)local_1b8._0_8_ != p_Var12);
  }
  local_1b8._0_8_ = p_Var12;
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
  ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>>
            ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
              *)&local_1d8,(_List_const_iterator<mocker::nasm::Line> *)local_1b8);
  local_158 = (long *)(lStack_1d0 + -8);
  if (local_1d8 != local_158) {
    plVar13 = local_1d8;
    do {
      plVar16 = (long *)*plVar13;
      plVar3 = (long *)plVar13[1];
      local_1b8._0_8_ = auStack_188;
      local_1b8._8_8_ = 1;
      local_1b8._16_8_ = (_Hash_node_base *)0x0;
      local_1b8._24_8_ = 0;
      local_198 = 1.0;
      local_190 = 0;
      auStack_188 = (undefined1  [8])0x0;
      local_1c0 = plVar16;
      local_150 = plVar13;
      if (plVar16 != plVar3) {
        lVar14 = 0;
        plVar13 = plVar16;
        do {
          if (plVar13[6] != 0) {
            nasm::getInvolvedRegs(&local_200,(shared_ptr<mocker::nasm::Inst> *)(plVar13 + 6));
            psVar6 = local_200.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (__k = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                __k != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar6; __k = __k + 1) {
              peVar4 = ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                       &__k->_vptr__Sp_counted_base)->_M_ptr;
              if ((peVar4->identifier)._M_string_length == 0) {
                std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
                goto LAB_00128b25;
              }
              if ((*(peVar4->identifier)._M_dataplus._M_p == 'v') &&
                 (iVar10 = std::
                           _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)local_1b8,(key_type *)__k),
                 iVar10.
                 super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
                 ._M_cur == (__node_type *)0x0)) {
                pmVar11 = std::__detail::
                          _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)local_1b8,(key_type *)__k);
                lVar1 = lVar14 * 8;
                lVar14 = lVar14 + 1;
                *pmVar11 = lVar1 + 8;
              }
            }
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::~vector(&local_200);
            plVar16 = local_1c0;
          }
          plVar13 = (long *)*plVar13;
        } while (plVar13 != plVar3);
      }
      uVar7 = local_1b8._24_8_;
      paVar15 = &local_60.label.field_2;
      local_60.label._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,plVar16[2],plVar16[3] + plVar16[2]);
      __position = &local_148.lines;
      paVar2 = &local_90.label.field_2;
      local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)plVar16[6];
      local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar16[7];
      if (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      _M_insert<mocker::nasm::Line>(__position,(iterator)__position,&local_60);
      if (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.label._M_dataplus._M_p != paVar15) {
        operator_delete(local_60.label._M_dataplus._M_p,
                        local_60.label.field_2._M_allocated_capacity + 1);
      }
      puVar5 = (undefined8 *)*local_1c0;
      nasm::dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_200,(shared_ptr<mocker::nasm::Inst> *)(puVar5 + 6));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_200.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00128b25:
        __assert_fail("nasm::dyc<nasm::Push>(lineIter->inst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                      ,0xf8,
                      "void mocker::(anonymous namespace)::allocate(LineIter, LineIter, nasm::Section &)"
                     );
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_200.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_200.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_90.label._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,puVar5[2],puVar5[3] + puVar5[2])
      ;
      local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)puVar5[6];
      local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar5[7];
      if (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      _M_insert<mocker::nasm::Line>(__position,(iterator)__position,&local_90);
      if (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.label._M_dataplus._M_p != paVar2) {
        operator_delete(local_90.label._M_dataplus._M_p,
                        local_90.label.field_2._M_allocated_capacity + 1);
      }
      puVar5 = (undefined8 *)*puVar5;
      nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_200,(shared_ptr<mocker::nasm::Inst> *)(puVar5 + 6));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_200.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        __assert_fail("nasm::dyc<nasm::Mov>(lineIter->inst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                      ,0xfb,
                      "void mocker::(anonymous namespace)::allocate(LineIter, LineIter, nasm::Section &)"
                     );
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_200.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_200.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_f0.label._M_dataplus._M_p = (pointer)&local_f0.label.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f0,puVar5[2],puVar5[3] + puVar5[2])
      ;
      local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)puVar5[6];
      local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar5[7];
      if (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      _M_insert<mocker::nasm::Line>(__position,(iterator)__position,&local_f0);
      if (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.label._M_dataplus._M_p != &local_f0.label.field_2) {
        operator_delete(local_f0.label._M_dataplus._M_p,
                        local_f0.label.field_2._M_allocated_capacity + 1);
      }
      plVar13 = (long *)*puVar5;
      lVar14 = (uVar7 & 0x1ffffffffffffffe) * 8 + 0x10;
      if (lVar14 != 0) {
        local_1dc = Sub;
        if ((nasm::rsp()::res == '\0') &&
           (iVar8 = __cxa_guard_acquire(&nasm::rsp()::res), iVar8 != 0)) {
          nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::rsp::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::rsp::res,
                     (allocator<mocker::nasm::Register> *)&local_200,(char (*) [4])"rsp");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
          __cxa_guard_release(&nasm::rsp()::res);
        }
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->_M_weak_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001efff8;
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)[1]._vptr__Sp_counted_base =
             (_func_int **)&PTR__Addr_001f0048;
        *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_200.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)[1]._M_use_count = lVar14;
        nasm::Section::
        emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                  (&local_148,&local_1dc,&nasm::rsp::res,
                   (shared_ptr<mocker::nasm::NumericConstant> *)&local_200);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_200.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_200.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      paVar15 = &local_c0.label.field_2;
      for (; plVar13 != plVar3; plVar13 = (long *)*plVar13) {
        if (plVar13[6] == 0) {
          local_c0.label._M_dataplus._M_p = (pointer)paVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,plVar13[2],plVar13[3] + plVar13[2]);
          local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)plVar13[6];
          local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar13[7];
          if (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
          _M_insert<mocker::nasm::Line>(&local_148.lines,(iterator)&local_148.lines,&local_c0);
          if (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.inst.
                       super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.label._M_dataplus._M_p != paVar15) {
            operator_delete(local_c0.label._M_dataplus._M_p,
                            local_c0.label.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          anon_unknown_1::allocate
                    ((shared_ptr<mocker::nasm::Inst> *)(plVar13 + 6),
                     (RegMap<std::size_t> *)local_1b8,&local_148);
        }
      }
      plVar13 = local_150 + 1;
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_1b8);
    } while (plVar13 != local_158);
  }
  if (local_1d8 != (long *)0x0) {
    operator_delete(local_1d8,local_1c8 - (long)local_1d8);
  }
  local_1b8._0_8_ = (_List_node_base *)(local_1b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,".text","");
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(local_160,(key_type *)local_1b8);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__cxx11::string::operator=
              ((string *)
               ((long)iVar9.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                      ._M_cur + 0x28),(string *)&local_148);
    std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_move_assign
              ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
               ((long)iVar9.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                      ._M_cur + 0x48),&local_148.lines);
    if ((_List_node_base *)local_1b8._0_8_ != (_List_node_base *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
              (&local_148.lines.
                super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.name._M_dataplus._M_p != &local_148.name.field_2) {
      operator_delete(local_148.name._M_dataplus._M_p,
                      local_148.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    return local_1e8;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

nasm::Module allocateRegistersNaively(const nasm::Module &module) {
  nasm::Module res(module);
  res.getSection(".text") = allocate(res.getSection(".text"));
  return res;
}